

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O0

void __thiscall
flatbuffers::BaseBfbsGenerator::ForAllFields
          (BaseBfbsGenerator *this,Object *object,bool reverse,
          function<void_(const_reflection::Field_*)> *func)

{
  size_type_conflict sVar1;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_00;
  const_reference pvVar2;
  return_type __args;
  size_type_conflict local_78;
  ulong local_48;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> field_to_id_map;
  function<void_(const_reflection::Field_*)> *func_local;
  bool reverse_local;
  Object *object_local;
  BaseBfbsGenerator *this_local;
  
  field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)func;
  anon_unknown_25::FieldIdToIndex((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,object);
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    if (sVar1 <= local_48) break;
    this_00 = reflection::Object::fields(object);
    if (reverse) {
      local_78 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      local_78 = local_78 - (local_48 + 1);
    }
    else {
      local_78 = local_48;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,local_78);
    __args = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(this_00,*pvVar2);
    std::function<void_(const_reflection::Field_*)>::operator()(func,__args);
    local_48 = local_48 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return;
}

Assistant:

void ForAllFields(const reflection::Object *object, bool reverse,
                    std::function<void(const reflection::Field *)> func) const {
    const std::vector<uint32_t> field_to_id_map = FieldIdToIndex(object);
    for (size_t i = 0; i < field_to_id_map.size(); ++i) {
      func(object->fields()->Get(
          field_to_id_map[reverse ? field_to_id_map.size() - (i + 1) : i]));
    }
  }